

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O1

void helper_chsc(CPUS390XState_conflict *env,uint64_t inst)

{
  return;
}

Assistant:

void HELPER(chsc)(CPUS390XState *env, uint64_t inst)
{
#if 0
    S390CPU *cpu = env_archcpu(env);
    qemu_mutex_lock_iothread();
    ioinst_handle_chsc(cpu, inst >> 16, GETPC());
    qemu_mutex_unlock_iothread();
#endif
}